

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void read_numeral(LexState *ls,SemInfo *seminfo)

{
  size_t sVar1;
  byte *pbVar2;
  int iVar3;
  ushort **ppuVar4;
  LexState *in_RSI;
  LexState *in_RDI;
  int in_stack_00000034;
  char *in_stack_00000038;
  LexState *in_stack_00000040;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  undefined2 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffea;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffffeb;
  uint in_stack_ffffffffffffffec;
  
  do {
    save(in_RSI,in_stack_ffffffffffffffec);
    sVar1 = in_RDI->z->n;
    in_RDI->z->n = sVar1 - 1;
    if (sVar1 == 0) {
      in_stack_ffffffffffffffec =
           luaZ_fill((ZIO *)CONCAT44(in_stack_ffffffffffffffec,
                                     CONCAT13(in_stack_ffffffffffffffeb,
                                              CONCAT12(in_stack_ffffffffffffffea,
                                                       in_stack_ffffffffffffffe8))));
    }
    else {
      pbVar2 = (byte *)in_RDI->z->p;
      in_RDI->z->p = (char *)(pbVar2 + 1);
      in_stack_ffffffffffffffec = (uint)*pbVar2;
    }
    in_RDI->current = in_stack_ffffffffffffffec;
    ppuVar4 = __ctype_b_loc();
    in_stack_ffffffffffffffeb = true;
    if (((*ppuVar4)[in_RDI->current] & 0x800) == 0) {
      in_stack_ffffffffffffffeb = in_RDI->current == 0x2e;
    }
  } while ((bool)in_stack_ffffffffffffffeb != false);
  iVar3 = check_next((LexState *)
                     CONCAT44(in_stack_ffffffffffffffec,
                              (uint)CONCAT12(in_stack_ffffffffffffffea,in_stack_ffffffffffffffe8)),
                     (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (iVar3 != 0) {
    check_next((LexState *)
               CONCAT44(in_stack_ffffffffffffffec,
                        CONCAT13(in_stack_ffffffffffffffeb,
                                 CONCAT12(in_stack_ffffffffffffffea,in_stack_ffffffffffffffe8))),
               (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  while( true ) {
    ppuVar4 = __ctype_b_loc();
    uVar5 = true;
    if (((*ppuVar4)[in_RDI->current] & 8) == 0) {
      uVar5 = in_RDI->current == 0x5f;
    }
    if ((bool)uVar5 == false) break;
    save(in_RSI,in_stack_ffffffffffffffec);
    sVar1 = in_RDI->z->n;
    in_RDI->z->n = sVar1 - 1;
    if (sVar1 == 0) {
      in_stack_ffffffffffffffe4 =
           luaZ_fill((ZIO *)CONCAT44(in_stack_ffffffffffffffec,
                                     CONCAT13(in_stack_ffffffffffffffeb,
                                              CONCAT12(uVar5,in_stack_ffffffffffffffe8))));
    }
    else {
      pbVar2 = (byte *)in_RDI->z->p;
      in_RDI->z->p = (char *)(pbVar2 + 1);
      in_stack_ffffffffffffffe4 = (uint)*pbVar2;
    }
    in_RDI->current = in_stack_ffffffffffffffe4;
  }
  save(in_RSI,in_stack_ffffffffffffffec);
  buffreplace(in_RDI,'.',in_RDI->decpoint);
  iVar3 = luaO_str2d((char *)CONCAT44(in_stack_ffffffffffffffec,
                                      CONCAT13(in_stack_ffffffffffffffeb,
                                               CONCAT12(uVar5,in_stack_ffffffffffffffe8))),
                     (lua_Number *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (iVar3 == 0) {
    luaX_lexerror(in_stack_00000040,in_stack_00000038,in_stack_00000034);
  }
  return;
}

Assistant:

static void read_numeral(LexState*ls,SemInfo*seminfo){
do{
save_and_next(ls);
}while(isdigit(ls->current)||ls->current=='.');
if(check_next(ls,"Ee"))
check_next(ls,"+-");
while(isalnum(ls->current)||ls->current=='_')
save_and_next(ls);
save(ls,'\0');
buffreplace(ls,'.',ls->decpoint);
if(!luaO_str2d(luaZ_buffer(ls->buff),&seminfo->r))
luaX_lexerror(ls,"malformed number",TK_NUMBER);
}